

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O0

void __thiscall
cmSearchPath::AddPathInternal(cmSearchPath *this,string *path,string *prefix,char *base)

{
  ulong uVar1;
  pair<std::_Rb_tree_const_iterator<cmSearchPath::PathWithPrefix>,_bool> pVar2;
  undefined1 local_e0 [8];
  PathWithPrefix pathWithPrefix;
  string local_90;
  string local_70 [8];
  string collapsedPrefix;
  undefined1 local_48 [8];
  string collapsedPath;
  char *base_local;
  string *prefix_local;
  string *path_local;
  cmSearchPath *this_local;
  
  collapsedPath.field_2._8_8_ = base;
  if (this->FC != (cmFindCommon *)0x0) {
    cmsys::SystemTools::CollapseFullPath((string *)local_48,path,base);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      std::__cxx11::string::string(local_70);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        cmsys::SystemTools::CollapseFullPath(&local_90,prefix,(char *)collapsedPath.field_2._8_8_);
        std::__cxx11::string::operator=(local_70,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      std::__cxx11::string::string((string *)local_e0,(string *)local_48);
      std::__cxx11::string::string
                ((string *)(pathWithPrefix.Path.field_2._M_local_buf + 8),local_70);
      pVar2 = std::
              set<cmSearchPath::PathWithPrefix,_std::less<cmSearchPath::PathWithPrefix>,_std::allocator<cmSearchPath::PathWithPrefix>_>
              ::insert(&this->FC->SearchPathsEmitted,(value_type *)local_e0);
      if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        std::vector<cmSearchPath::PathWithPrefix,_std::allocator<cmSearchPath::PathWithPrefix>_>::
        emplace_back<cmSearchPath::PathWithPrefix>(&this->Paths,(PathWithPrefix *)local_e0);
      }
      PathWithPrefix::~PathWithPrefix((PathWithPrefix *)local_e0);
      std::__cxx11::string::~string(local_70);
      collapsedPrefix.field_2._12_4_ = 0;
    }
    else {
      collapsedPrefix.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_48);
    return;
  }
  __assert_fail("this->FC != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmSearchPath.cxx"
                ,0xd1,
                "void cmSearchPath::AddPathInternal(const std::string &, const std::string &, const char *)"
               );
}

Assistant:

void cmSearchPath::AddPathInternal(const std::string& path,
                                   const std::string& prefix, const char* base)
{
  assert(this->FC != nullptr);

  std::string collapsedPath = cmSystemTools::CollapseFullPath(path, base);

  if (collapsedPath.empty()) {
    return;
  }

  std::string collapsedPrefix;
  if (!prefix.empty()) {
    collapsedPrefix = cmSystemTools::CollapseFullPath(prefix, base);
  }

  // Insert the path if has not already been emitted.
  PathWithPrefix pathWithPrefix{ std::move(collapsedPath),
                                 std::move(collapsedPrefix) };
  if (this->FC->SearchPathsEmitted.insert(pathWithPrefix).second) {
    this->Paths.emplace_back(std::move(pathWithPrefix));
  }
}